

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O1

void f_cold_2(void)

{
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed - returned NULL pointer\n\n","N_VGetArrayPointer");
  return;
}

Assistant:

static int check_retval(void* returnvalue, const char* funcname, int opt)
{
  int* errvalue;

  /* Check if SUNDIALS function returned NULL pointer - no memory allocated */
  if (opt == 0 && returnvalue == NULL)
  {
    fprintf(stderr, "\nSUNDIALS_ERROR: %s() failed - returned NULL pointer\n\n",
            funcname);
    return 1;
  }

  /* Check if flag < 0 */
  else if (opt == 1)
  {
    errvalue = (int*)returnvalue;
    if (*errvalue < 0)
    {
      fprintf(stderr, "\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
              funcname, *errvalue);
      return 1;
    }
  }

  /* Check if function returned NULL pointer - no memory allocated */
  else if (opt == 2 && returnvalue == NULL)
  {
    fprintf(stderr, "\nMEMORY_ERROR: %s() failed - returned NULL pointer\n\n",
            funcname);
    return 1;
  }

  return 0;
}